

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<double,_float>::initialize
          (DensityCalculator<double,_float> *this,size_t max_depth,int max_categ,bool reserve_counts
          ,ScoringMetric scoring_metric)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  value_type_conflict *in_RDI;
  int in_R8D;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  uVar1 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  std::vector<double,_std::allocator<double>_>::reserve(unaff_retaddr,(size_type)in_RDI);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x45a9ef);
  if (in_R8D == 0x5d) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)0x3ff0000000000000,in_RDI);
  }
  else {
    std::vector<double,_std::allocator<double>_>::push_back(in_stack_ffffffffffffffd0,in_RDI);
  }
  if ((uVar1 & 0x1000000) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_RSI,CONCAT44(in_EDX,uVar1));
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize(size_t max_depth, int max_categ, bool reserve_counts, ScoringMetric scoring_metric)
{
    this->multipliers.reserve(max_depth+3);
    this->multipliers.clear();
    if (scoring_metric != AdjDensity)
        this->multipliers.push_back(0);
    else
        this->multipliers.push_back(1);

    if (reserve_counts)
    {
        this->counts.resize(max_categ);
    }
}